

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O3

void Pla_ManConvertToBits(Pla_Man_t *p)

{
  ulong *puVar1;
  size_t __size;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  undefined1 auVar6 [16];
  int *piVar7;
  word *pwVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  long lVar15;
  
  uVar2 = (p->vCubeLits).nSize;
  if ((p->vCubes).nCap < (int)uVar2) {
    piVar7 = (p->vCubes).pArray;
    __size = (long)(int)uVar2 * 4;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(piVar7,__size);
    }
    (p->vCubes).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCubes).nCap = uVar2;
  }
  auVar6 = _DAT_008403e0;
  if (0 < (int)uVar2) {
    piVar7 = (p->vCubes).pArray;
    lVar15 = (ulong)uVar2 - 1;
    auVar13._8_4_ = (int)lVar15;
    auVar13._0_8_ = lVar15;
    auVar13._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar9 = 0;
    auVar13 = auVar13 ^ _DAT_008403e0;
    auVar14 = _DAT_008403d0;
    do {
      auVar16 = auVar14 ^ auVar6;
      if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                  auVar13._4_4_ < auVar16._4_4_) & 1)) {
        piVar7[uVar9] = (int)uVar9;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        piVar7[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar15 + 2;
    } while ((uVar2 + 1 & 0xfffffffe) != uVar9);
  }
  (p->vCubes).nSize = uVar2;
  uVar9 = (long)p->nInWords * (long)(int)uVar2;
  iVar12 = (int)uVar9;
  if ((p->vInBits).nCap < iVar12) {
    pwVar8 = (p->vInBits).pArray;
    if (pwVar8 == (word *)0x0) {
      pwVar8 = (word *)malloc(uVar9 * 8);
    }
    else {
      pwVar8 = (word *)realloc(pwVar8,uVar9 * 8);
    }
    (p->vInBits).pArray = pwVar8;
    if (pwVar8 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p->vInBits).nCap = iVar12;
  }
  if (0 < iVar12) {
    memset((p->vInBits).pArray,0,(uVar9 & 0xffffffff) << 3);
  }
  (p->vInBits).nSize = iVar12;
  uVar2 = (p->vCubeLits).nSize;
  if (0 < (int)uVar2) {
    pVVar5 = (p->vCubeLits).pArray;
    uVar9 = 0;
    do {
      uVar3 = pVVar5[uVar9].nSize;
      if (0 < (int)uVar3) {
        uVar10 = p->nInWords * (int)uVar9;
        if (((int)uVar10 < 0) || (iVar12 <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        piVar7 = pVVar5[uVar9].pArray;
        uVar11 = 0;
        do {
          uVar4 = piVar7[uVar11];
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          puVar1 = (p->vInBits).pArray + (ulong)uVar10 + (ulong)(uVar4 >> 6);
          *puVar1 = *puVar1 | 2 - (ulong)(uVar4 & 1) << ((byte)uVar4 & 0x3e);
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  return;
}

Assistant:

void Pla_ManConvertToBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube; int i, k, Lit;
    Vec_IntFillNatural( &p->vCubes, Vec_WecSize(&p->vCubeLits) );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        Vec_IntForEachEntry( vCube, Lit, k )
            Pla_CubeSetLit( Pla_CubeIn(p, i), Abc_Lit2Var(Lit), Abc_LitIsCompl(Lit) ? PLA_LIT_ZERO : PLA_LIT_ONE );
}